

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O1

int runstattests(double *x,int N,char *test,char *mtype,double alpha)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dStack_f8;
  double cval [9];
  double dStack_a8;
  double auxstat [2];
  double teststat [3];
  double dStack_78;
  double cprobs [3];
  int local_58;
  int cvrows;
  int cvcols;
  int ltstat;
  double stat;
  double pval;
  int local_34 [2];
  int klag;
  
  cval[7] = 0.0;
  cval[5] = 0.0;
  cval[6] = 0.0;
  cval[3] = 0.0;
  cval[4] = 0.0;
  cval[1] = 0.0;
  cval[2] = 0.0;
  dStack_f8 = 0.0;
  cval[0] = 0.0;
  cprobs[1] = 0.0;
  dStack_78 = 0.0;
  cprobs[0] = 0.0;
  dStack_a8 = 0.0;
  auxstat[0] = 0.0;
  auxstat[1] = 0.0;
  pval = alpha;
  iVar2 = strcmp(test,"kpss");
  if (iVar2 == 0) {
    pcVar3 = "level";
    iVar2 = strcmp(mtype,"level");
    if (iVar2 != 0) {
      pcVar3 = "trend";
      iVar2 = strcmp(mtype,"trend");
      if (iVar2 != 0) {
LAB_001340d6:
        pcVar3 = "ndiffs only accepts one of two types : level and trend. ";
LAB_001340e6:
        puts(pcVar3);
        exit(-1);
      }
    }
    dVar1 = (double)N;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    local_34[0] = (int)((dVar1 * 3.0) / 13.0);
    ur_kpss(x,N,pcVar3,1,local_34,(double *)&cvcols,&stat);
    bVar5 = pval == stat;
    bVar4 = pval < stat;
  }
  else {
    iVar2 = strcmp(test,"df");
    if ((iVar2 == 0) || (iVar2 = strcmp(test,"adf"), iVar2 == 0)) {
      iVar2 = strcmp(mtype,"level");
      if (iVar2 == 0) {
        pcVar3 = "drift";
      }
      else {
        pcVar3 = "trend";
        iVar2 = strcmp(mtype,"trend");
        if (iVar2 != 0) goto LAB_001340d6;
      }
      local_34[0] = 1;
      ur_df2(x,N,pcVar3,local_34,"fixed",&dStack_f8,(int *)((long)cprobs + 0x14),&local_58,
             &dStack_78,auxstat + 1,&cvrows);
      uVar6 = SUB84(auxstat[1],0);
      uVar7 = (undefined4)((ulong)auxstat[1] >> 0x20);
      _cvcols = auxstat[1];
    }
    else {
      iVar2 = strcmp(test,"pp");
      if (iVar2 != 0) {
        pcVar3 = "Only three tests are allowed - kpss, df and pp ";
        goto LAB_001340e6;
      }
      iVar2 = strcmp(mtype,"level");
      if (iVar2 == 0) {
        pcVar3 = "constant";
      }
      else {
        pcVar3 = "trend";
        iVar2 = strcmp(mtype,"trend");
        if (iVar2 != 0) {
          pcVar3 = "ndiffs KPSS only accepts one of two types : level and trend. ";
          goto LAB_001340e6;
        }
      }
      ur_pp2(x,N,"Z-tau",pcVar3,1,(int *)0x0,&dStack_f8,&dStack_78,&dStack_a8,local_34,
             (double *)&cvcols);
      uVar6 = SUB84(_cvcols,0);
      uVar7 = (undefined4)((ulong)_cvcols >> 0x20);
    }
    dVar1 = interpolate_linear(&dStack_f8,&dStack_78,3,(double)CONCAT44(uVar7,uVar6));
    bVar5 = dVar1 == pval;
    bVar4 = dVar1 < pval;
  }
  return (int)(!bVar4 && !bVar5);
}

Assistant:

static int runstattests(double *x, int N, const char * test,const char *mtype,double alpha) {
    int diff,klag,lshort;
    const char *alternative;
    const char *type;
    const char *model;
    const char *selectlags;
    double stat, pval;
    double cval[9] = {0,0,0,0,0,0,0,0,0};
	double cprobs[3] = {0,0,0};
	double auxstat[2] = {0,0};
    double teststat[3] = {0,0,0};
	int laux,pN,cvrows,cvcols,ltstat;

    if (!strcmp(test,"kpss")) {
        if (!strcmp(mtype,"level")) {
            type = "level";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        
        klag = (int) 3.0 * sqrt((double)N) / 13.0;
        lshort = 1;
        ur_kpss(x,N,type,lshort,&klag,&stat,&pval);
        //printf("KPSS stat %g pval %g \n",stat,pval);
        diff = (pval < alpha) ? 1 : 0;
    } else if (!strcmp(test,"df") || !strcmp(test,"adf")) {
        if (!strcmp(mtype,"level")) {
            type = "drift";
        } else if (!strcmp(mtype,"trend")) {
            type = "trend";
        } else {
            printf("ndiffs only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        selectlags = "fixed";
        klag = 1;
        pN = 3;
        //alternative = "stationary";
        //ur_df(x,N,alternative,NULL,&stat,&pval);
        ur_df2(x,N,type,&klag,selectlags,cval,&cvrows,&cvcols, cprobs, teststat,&ltstat);
        stat = teststat[0];
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("ADF stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else if (!strcmp(test,"pp")) {
        if (!strcmp(mtype,"level")) {
            model = "constant";
        } else if (!strcmp(mtype,"trend")) {
            model = "trend";
        } else {
            printf("ndiffs KPSS only accepts one of two types : level and trend. \n");
            exit(-1);
        }
        type = "Z-tau";
        lshort = 1;
        pN = 3;
        //ur_pp(x,N,alternative,type,lshort,NULL, &stat,&pval);
        ur_pp2(x,N,type,model,lshort,NULL,cval,cprobs,auxstat,&laux,&stat);
        pval = interpolate_linear(cval,cprobs,pN,stat);
        //printf("PP stat %g pval %g \n",stat,pval);
        diff = (pval > alpha) ? 1 : 0;
    } else {
        printf("Only three tests are allowed - kpss, df and pp \n");
        exit(-1);
    }

    return diff;
}